

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

void __thiscall wabt::TypeChecker::PushType(TypeChecker *this,Type type)

{
  Enum EVar1;
  TypeChecker *this_local;
  Type type_local;
  
  this_local._4_4_ = type.enum_;
  EVar1 = Type::operator_cast_to_Enum((Type *)((long)&this_local + 4));
  if (EVar1 != Void) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
              (&this->type_stack_,(value_type *)((long)&this_local + 4));
  }
  return;
}

Assistant:

void TypeChecker::PushType(Type type) {
  if (type != Type::Void) {
    type_stack_.push_back(type);
  }
}